

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialize_node<std::istream,short,unsigned_long>
               (IsoTree *node,basic_istream<char,_std::char_traits<char>_> *in,
               vector<char,_std::allocator<char>_> *buffer,bool diff_endian)

{
  uint *in_RDI;
  size_t data_sizets [4];
  double data_doubles [6];
  uint8_t data_en;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  istream *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  byte local_1a;
  
  if (!interrupt_switch) {
    read_bytes<unsigned_char>
              ((void *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               (size_t)in_stack_ffffffffffffff88,(istream *)0x665700);
    *in_RDI = (uint)local_1a;
    read_bytes<int,short>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98,(bool)in_stack_ffffffffffffff97);
    read_bytes<double,double>
              (in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,
               (istream *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,false);
    *(size_t *)(in_RDI + 4) = in_stack_ffffffffffffffa8;
    *(void **)(in_RDI + 0x12) = in_stack_ffffffffffffffb0;
    *(undefined8 *)(in_RDI + 0x14) = local_48;
    *(undefined8 *)(in_RDI + 0x16) = local_40;
    *(undefined8 *)(in_RDI + 0x18) = local_38;
    *(undefined8 *)(in_RDI + 0x1a) = local_30;
    read_bytes<unsigned_long,unsigned_long>
              (in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,
               (istream *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,false);
    *(vector<char,_std::allocator<char>_> **)(in_RDI + 2) = in_stack_ffffffffffffff88;
    *(ulong *)(in_RDI + 0xe) = CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90);
    *(vector<char,_std::allocator<char>_> **)(in_RDI + 0x10) = in_stack_ffffffffffffff98;
    read_bytes<signed_char,signed_char>
              ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_ffffffffffffffa0,
               (size_t)in_stack_ffffffffffffff98,
               (istream *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,false);
  }
  return;
}

Assistant:

void deserialize_node(IsoTree &node, itype &in, std::vector<char> &buffer, const bool diff_endian)
{
    if (interrupt_switch) return;

    uint8_t data_en;
    read_bytes<uint8_t>((void*)&data_en, (size_t)1, in);
    node.col_type = (ColType)data_en;

    read_bytes<int, saved_int_t>((void*)&node.chosen_cat, (size_t)1, in, buffer, diff_endian);

    double data_doubles[6];
    read_bytes<double, double>((void*)data_doubles, (size_t)6, in, buffer, diff_endian);
    node.num_split = data_doubles[0];
    node.pct_tree_left = data_doubles[1];
    node.score = data_doubles[2];
    node.range_low = data_doubles[3];
    node.range_high = data_doubles[4];
    node.remainder = data_doubles[5];

    size_t data_sizets[4];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)4, in, buffer, diff_endian);
    node.col_num = data_sizets[0];
    node.tree_left = data_sizets[1];
    node.tree_right = data_sizets[2];
    read_bytes<signed char, signed char>(node.cat_split, data_sizets[3], in, buffer, diff_endian);
}